

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O2

int ssl_cert_cache_chain_certs(CERT *cert)

{
  ssl_credential_st *psVar1;
  tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter> sk;
  UniquePtr<struct_stack_st_X509> UVar2;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar3;
  size_t sVar4;
  CRYPTO_BUFFER *buf;
  _Head_base<0UL,_x509_st_*,_false> _Var5;
  int iVar6;
  ulong i;
  UniquePtr<struct_stack_st_X509> chain;
  UniquePtr<X509> x509;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_38;
  
  if (cert->x509_method == (SSL_X509_METHOD *)0x0) {
    __assert_fail("cert->x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x2e6,"int ssl_cert_cache_chain_certs(CERT *)");
  }
  iVar6 = 1;
  if (cert->x509_chain == (stack_st_X509 *)0x0) {
    psVar1 = (cert->legacy_credential)._M_t.
             super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
    sk.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter> *)
          &(psVar1->chain)._M_t.
           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>;
    if ((sk.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
         (_Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>)0x0) &&
       (sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)
                               sk.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl)
       , 1 < sVar4)) {
      chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
           (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
           OPENSSL_sk_new_null();
      iVar6 = 0;
      if ((tuple<stack_st_X509_*,_bssl::internal::Deleter>)
          chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
          (_Head_base<0UL,_stack_st_X509_*,_false>)0x0) {
        i = 1;
        do {
          sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)
                                 (psVar1->chain)._M_t.
                                 super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                );
          UVar2 = chain;
          if (sVar4 <= i) {
            chain._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
                 (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>)0x0;
            cert->x509_chain =
                 (stack_st_X509 *)
                 UVar2._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
            iVar6 = 1;
            break;
          }
          buf = (CRYPTO_BUFFER *)
                OPENSSL_sk_value((OPENSSL_STACK *)
                                 (psVar1->chain)._M_t.
                                 super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                 ,i);
          _Var5._M_head_impl = X509_parse_from_buffer(buf);
          if ((tuple<x509_st_*,_bssl::internal::Deleter>)_Var5._M_head_impl ==
              (_Head_base<0UL,_x509_st_*,_false>)0x0) {
            x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)_Var5._M_head_impl;
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&x509);
            break;
          }
          x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
          local_38._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)_Var5._M_head_impl;
          eVar3 = bssl::PushToStack<stack_st_X509>
                            ((stack_st_X509 *)
                             chain._M_t.
                             super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,&local_38);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&x509);
          i = i + 1;
        } while (eVar3);
      }
      std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&chain);
    }
  }
  return iVar6;
}

Assistant:

static int ssl_cert_cache_chain_certs(CERT *cert) {
  assert(cert->x509_method);

  const SSL_CREDENTIAL *cred = cert->legacy_credential.get();
  if (cert->x509_chain != nullptr || cred->chain == nullptr ||
      sk_CRYPTO_BUFFER_num(cred->chain.get()) < 2) {
    return 1;
  }

  UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return 0;
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    UniquePtr<X509> x509(X509_parse_from_buffer(buffer));
    if (!x509 ||  //
        !PushToStack(chain.get(), std::move(x509))) {
      return 0;
    }
  }

  cert->x509_chain = chain.release();
  return 1;
}